

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O3

void __thiscall HEkkDual::initialiseInstance(HEkkDual *this)

{
  int iVar1;
  int size_;
  HEkk *pHVar2;
  
  pHVar2 = this->ekk_instance_;
  iVar1 = (pHVar2->lp_).num_col_;
  this->solver_num_col = iVar1;
  size_ = (pHVar2->lp_).num_row_;
  this->solver_num_row = size_;
  this->solver_num_tot = iVar1 + size_;
  this->inv_solver_num_row = 1.0 / (double)size_;
  this->a_matrix = &(pHVar2->lp_).a_matrix_;
  this->simplex_nla = &pHVar2->simplex_nla_;
  this->analysis = &pHVar2->analysis_;
  this->jMove = (pHVar2->basis_).nonbasicMove_.
                super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this->workDual =
       (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->workValue =
       (pHVar2->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->workRange =
       (pHVar2->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->baseLower =
       (pHVar2->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->baseUpper =
       (pHVar2->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->baseValue =
       (pHVar2->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  HVectorBase<double>::setup(&this->col_DSE,size_);
  HVectorBase<double>::setup(&this->col_BFRT,this->solver_num_row);
  HVectorBase<double>::setup(&this->col_aq,this->solver_num_row);
  HVectorBase<double>::setup(&this->row_ep,this->solver_num_row);
  HVectorBase<double>::setup(&this->row_ap,this->solver_num_col);
  HVectorBase<double>::setup(&this->dev_row_ep,this->solver_num_row);
  HVectorBase<double>::setup(&this->dev_col_DSE,this->solver_num_row);
  HEkkDualRow::setup(&this->dualRow);
  HEkkDualRHS::setup(&this->dualRHS);
  return;
}

Assistant:

void HEkkDual::initialiseInstance() {
  // Called in constructor for HEkkDual class
  // Copy size, matrix and simplex NLA

  solver_num_col = ekk_instance_.lp_.num_col_;
  solver_num_row = ekk_instance_.lp_.num_row_;
  solver_num_tot = solver_num_col + solver_num_row;
  inv_solver_num_row = 1.0 / solver_num_row;

  a_matrix = &ekk_instance_.lp_.a_matrix_;
  simplex_nla = &ekk_instance_.simplex_nla_;
  analysis = &ekk_instance_.analysis_;

  // Copy pointers
  jMove = ekk_instance_.basis_.nonbasicMove_.data();
  workDual = ekk_instance_.info_.workDual_.data();
  workValue = ekk_instance_.info_.workValue_.data();
  workRange = ekk_instance_.info_.workRange_.data();
  baseLower = ekk_instance_.info_.baseLower_.data();
  baseUpper = ekk_instance_.info_.baseUpper_.data();
  baseValue = ekk_instance_.info_.baseValue_.data();

  // Setup local vectors
  col_DSE.setup(solver_num_row);
  col_BFRT.setup(solver_num_row);
  col_aq.setup(solver_num_row);
  row_ep.setup(solver_num_row);
  row_ap.setup(solver_num_col);

  dev_row_ep.setup(solver_num_row);
  dev_col_DSE.setup(solver_num_row);

  // Setup other buffers
  dualRow.setup();
  dualRHS.setup();
}